

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode Curl_multi_add_perform(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  SingleRequest *k;
  CURLMcode rc;
  connectdata *conn_local;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  if ((multi->in_callback & 1U) == 0) {
    multi_local._4_4_ = curl_multi_add_handle(multi,data);
    if (multi_local._4_4_ == CURLM_OK) {
      Curl_init_do(data,(connectdata *)0x0);
      mstate(data,MSTATE_PERFORMING);
      Curl_attach_connection(data,conn);
      (data->req).keepon = (data->req).keepon | 1;
    }
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode Curl_multi_add_perform(struct Curl_multi *multi,
                                 struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLMcode rc;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  rc = curl_multi_add_handle(multi, data);
  if(!rc) {
    struct SingleRequest *k = &data->req;

    /* pass in NULL for 'conn' here since we don't want to init the
       connection, only this transfer */
    Curl_init_do(data, NULL);

    /* take this handle to the perform state right away */
    multistate(data, MSTATE_PERFORMING);
    Curl_attach_connection(data, conn);
    k->keepon |= KEEP_RECV; /* setup to receive! */
  }
  return rc;
}